

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O1

void google::protobuf::compiler::annotation_test_util::AddFile
               (string_view filename,string_view data)

{
  undefined8 extraout_RAX;
  AlphaNum *in_R8;
  string_view contents;
  Status local_100;
  string local_f8;
  long *local_d8;
  undefined8 local_d0;
  long local_c8 [2];
  undefined8 local_b8;
  long *local_b0;
  AlphaNum local_88;
  AlphaNum local_58;
  
  TestTempDir_abi_cxx11_();
  local_b8 = local_d0;
  local_b0 = local_d8;
  local_58.piece_._M_len = 1;
  local_58.piece_._M_str = "/";
  local_88.piece_._M_len = filename._M_len;
  local_88.piece_._M_str = filename._M_str;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_f8,(lts_20250127 *)&local_b8,&local_58,&local_88,in_R8);
  contents._M_str = (char *)data._M_len;
  contents._M_len = (size_t)&local_100;
  File::WriteStringToFile(contents,(string *)data._M_str);
  if ((StatusRep *)local_100.rep_ != (StatusRep *)0x1) {
    absl::lts_20250127::status_internal::MakeCheckFailString
              (&local_100,
               "File::SetContents( absl::StrCat(TestTempDir(), \"/\", filename), data, true) is OK")
    ;
  }
  if ((local_100.rep_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_100.rep_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if ((StatusRep *)local_100.rep_ != (StatusRep *)0x1) {
    AddFile();
    __clang_call_terminate(extraout_RAX);
  }
  return;
}

Assistant:

void AddFile(absl::string_view filename, absl::string_view data) {
  ABSL_CHECK_OK(File::SetContents(
      absl::StrCat(TestTempDir(), "/", filename), data, true));
}